

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeerGateway.hpp
# Opt level: O2

void __thiscall
ableton::discovery::
PeerGateway<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>::GatewayObserver,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
::Impl::onByeBye(Impl *this,NodeId *peerId)

{
  iterator __position;
  
  __position = findPeer(this,peerId);
  if (__position._M_current !=
      (this->mPeerTimeouts).
      super__Vector_base<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ableton::link::NodeId>,_std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ableton::link::NodeId>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ableton::link::peerLeft(&(this->mObserver).val,&(__position._M_current)->second);
    std::
    vector<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ableton::link::NodeId>,_std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ableton::link::NodeId>_>_>
    ::erase(&this->mPeerTimeouts,(const_iterator)__position._M_current);
    return;
  }
  return;
}

Assistant:

void onByeBye(const NodeId& peerId)
    {
      const auto it = findPeer(peerId);
      if (it != mPeerTimeouts.end())
      {
        peerLeft(*mObserver, it->second);
        mPeerTimeouts.erase(it);
      }
    }